

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_file_types.cpp
# Opt level: O0

format crnlib::texture_file_types::determine_file_format(char *pFilename)

{
  bool bVar1;
  char cVar2;
  char *p;
  format local_3c;
  uint i;
  undefined1 local_28 [8];
  dynamic_string ext;
  char *pFilename_local;
  
  ext.m_pStr = pFilename;
  dynamic_string::dynamic_string((dynamic_string *)local_28);
  bVar1 = file_utils::split_path
                    (ext.m_pStr,(dynamic_string *)0x0,(dynamic_string *)0x0,(dynamic_string *)0x0,
                     (dynamic_string *)local_28);
  if (bVar1) {
    bVar1 = dynamic_string::is_empty((dynamic_string *)local_28);
    if (bVar1) {
      pFilename_local._4_4_ = cFormatInvalid;
    }
    else {
      cVar2 = dynamic_string::operator[]((dynamic_string *)local_28,0);
      if (cVar2 == '.') {
        dynamic_string::right((dynamic_string *)local_28,1);
      }
      for (local_3c = cFormatDDS; (uint)local_3c < 0x11; local_3c = local_3c + cFormatCRN) {
        p = get_extension(local_3c);
        bVar1 = dynamic_string::operator==((dynamic_string *)local_28,p);
        if (bVar1) {
          pFilename_local._4_4_ = local_3c;
          goto LAB_0017a95b;
        }
      }
      pFilename_local._4_4_ = cFormatInvalid;
    }
  }
  else {
    pFilename_local._4_4_ = cFormatInvalid;
  }
LAB_0017a95b:
  dynamic_string::~dynamic_string((dynamic_string *)local_28);
  return pFilename_local._4_4_;
}

Assistant:

texture_file_types::format texture_file_types::determine_file_format(const char* pFilename)
    {
        dynamic_string ext;
        if (!file_utils::split_path(pFilename, nullptr, nullptr, nullptr, &ext))
        {
            return cFormatInvalid;
        }

        if (ext.is_empty())
        {
            return cFormatInvalid;
        }

        if (ext[0] == '.')
        {
            ext.right(1);
        }

        for (uint i = 0; i < cNumFileFormats; i++)
        {
            if (ext == get_extension(static_cast<format>(i)))
            {
                return static_cast<format>(i);
            }
        }
        return cFormatInvalid;
    }